

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * __thiscall
cmCompiledGeneratorExpression::EvaluateWithContext_abi_cxx11_
          (cmCompiledGeneratorExpression *this,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  reference ppcVar2;
  iterator __first;
  iterator __last;
  string local_68 [32];
  cmGeneratorExpressionEvaluator *local_48;
  cmGeneratorExpressionEvaluator *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *__range1;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorExpressionContext *context_local;
  cmCompiledGeneratorExpression *this_local;
  
  if ((this->NeedsEvaluation & 1U) == 0) {
    this_local = (cmCompiledGeneratorExpression *)&this->Input;
  }
  else {
    std::__cxx11::string::clear();
    __end1 = std::
             vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             ::begin(&this->Evaluators);
    it = (cmGeneratorExpressionEvaluator *)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(&this->Evaluators);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                                       *)&it), bVar1) {
      ppcVar2 = __gnu_cxx::
                __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                ::operator*(&__end1);
      local_48 = *ppcVar2;
      (*local_48->_vptr_cmGeneratorExpressionEvaluator[3])(local_68,local_48,context,dagChecker);
      std::__cxx11::string::operator+=((string *)&this->Output,local_68);
      std::__cxx11::string::~string(local_68);
      __first = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::cbegin(&context->SeenTargetProperties);
      __last = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::cend(&context->SeenTargetProperties);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->SeenTargetProperties,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__first._M_node,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__last._M_node);
      if ((context->HadError & 1U) != 0) {
        std::__cxx11::string::clear();
        break;
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
      ::operator++(&__end1);
    }
    std::
    map<const_cmGeneratorTarget_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::operator=(&this->MaxLanguageStandard,&context->MaxLanguageStandard);
    if ((context->HadError & 1U) == 0) {
      this->HadContextSensitiveCondition = (bool)(context->HadContextSensitiveCondition & 1);
      this->HadHeadSensitiveCondition = (bool)(context->HadHeadSensitiveCondition & 1);
      std::
      set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::operator=(&this->SourceSensitiveTargets,&context->SourceSensitiveTargets);
    }
    std::
    set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
    operator=(&this->DependTargets,&context->DependTargets);
    std::
    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::operator=(&this->AllTargetsSeen,&context->AllTargets);
    this_local = (cmCompiledGeneratorExpression *)&this->Output;
  }
  return (string *)this_local;
}

Assistant:

const std::string& cmCompiledGeneratorExpression::EvaluateWithContext(
  cmGeneratorExpressionContext& context,
  cmGeneratorExpressionDAGChecker* dagChecker) const
{
  if (!this->NeedsEvaluation) {
    return this->Input;
  }

  this->Output.clear();

  for (const cmGeneratorExpressionEvaluator* it : this->Evaluators) {
    this->Output += it->Evaluate(&context, dagChecker);

    this->SeenTargetProperties.insert(context.SeenTargetProperties.cbegin(),
                                      context.SeenTargetProperties.cend());
    if (context.HadError) {
      this->Output.clear();
      break;
    }
  }

  this->MaxLanguageStandard = context.MaxLanguageStandard;

  if (!context.HadError) {
    this->HadContextSensitiveCondition = context.HadContextSensitiveCondition;
    this->HadHeadSensitiveCondition = context.HadHeadSensitiveCondition;
    this->SourceSensitiveTargets = context.SourceSensitiveTargets;
  }

  this->DependTargets = context.DependTargets;
  this->AllTargetsSeen = context.AllTargets;
  return this->Output;
}